

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O0

void __thiscall
node::anon_unknown_2::NotificationsHandlerImpl::disconnect(NotificationsHandlerImpl *this)

{
  long lVar1;
  bool bVar2;
  long in_RDI;
  long in_FS_OFFSET;
  __shared_ptr<node::(anonymous_namespace)::NotificationsProxy,_(__gnu_cxx::_Lock_policy)2>
  *in_stack_ffffffffffffffa8;
  shared_ptr<CValidationInterface> *in_stack_ffffffffffffffb0;
  __shared_ptr<node::(anonymous_namespace)::NotificationsProxy,_(__gnu_cxx::_Lock_policy)2> *this_00
  ;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::__shared_ptr::operator_cast_to_bool(in_stack_ffffffffffffffa8);
  if (bVar2) {
    this_00 = *(__shared_ptr<node::(anonymous_namespace)::NotificationsProxy,_(__gnu_cxx::_Lock_policy)2>
                **)(in_RDI + 8);
    std::shared_ptr<CValidationInterface>::
    shared_ptr<node::(anonymous_namespace)::NotificationsProxy,void>
              ((shared_ptr<CValidationInterface> *)in_stack_ffffffffffffffa8,
               (shared_ptr<node::(anonymous_namespace)::NotificationsProxy> *)0x11c6d35);
    ValidationSignals::UnregisterSharedValidationInterface
              ((ValidationSignals *)this_00,in_stack_ffffffffffffffb0);
    std::shared_ptr<CValidationInterface>::~shared_ptr
              ((shared_ptr<CValidationInterface> *)in_stack_ffffffffffffffa8);
    std::__shared_ptr<node::(anonymous_namespace)::NotificationsProxy,_(__gnu_cxx::_Lock_policy)2>::
    reset(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void disconnect() override
    {
        if (m_proxy) {
            m_signals.UnregisterSharedValidationInterface(m_proxy);
            m_proxy.reset();
        }
    }